

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

void __thiscall basisu::basisu_frontend::generate_block_endpoint_clusters(basisu_frontend *this)

{
  uint uVar1;
  vec2U *pvVar2;
  ulong uVar3;
  vector<unsigned_int> *pvVar4;
  ulong uVar5;
  char *__function;
  long lVar6;
  uint32_t new_size;
  uint uVar7;
  
  uVar1 = this->m_total_blocks;
  uVar7 = (this->m_block_endpoint_clusters_indices).m_size;
  if (uVar7 != uVar1) {
    if ((uVar7 <= uVar1) && ((this->m_block_endpoint_clusters_indices).m_capacity < uVar1)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_block_endpoint_clusters_indices,uVar1,
                 uVar7 + 1 == uVar1,8,(object_mover)0x0,false);
    }
    (this->m_block_endpoint_clusters_indices).m_size = uVar1;
  }
  uVar1 = (this->m_endpoint_clusters).m_size;
  uVar5 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      if ((uVar5 & 0xffffffff) <= uVar3) {
        __function = 
        "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
        ;
        goto LAB_00234329;
      }
      pvVar4 = (this->m_endpoint_clusters).m_p;
      if (pvVar4[uVar3].m_size != 0) {
        pvVar4 = pvVar4 + uVar3;
        lVar6 = 0;
        do {
          uVar1 = pvVar4->m_p[lVar6];
          uVar7 = uVar1 >> 1;
          if ((this->m_block_endpoint_clusters_indices).m_size <= uVar7) goto LAB_00234314;
          (this->m_block_endpoint_clusters_indices).m_p[uVar7].m_comps[uVar1 & 1] = (uint32_t)uVar3;
          lVar6 = lVar6 + 1;
        } while ((uint)lVar6 < pvVar4->m_size);
      }
      uVar3 = uVar3 + 1;
      uVar5 = (ulong)(int)(this->m_endpoint_clusters).m_size;
    } while ((long)uVar3 < (long)uVar5);
  }
  if (((this->m_params).m_validate == true) && (this->m_total_blocks != 0)) {
    pvVar2 = (this->m_block_endpoint_clusters_indices).m_p;
    lVar6 = 0;
    do {
      if ((this->m_block_endpoint_clusters_indices).m_size == (uint32_t)lVar6) {
LAB_00234314:
        __function = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
LAB_00234329:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      if (pvVar2[lVar6].m_comps[0] != pvVar2[lVar6].m_comps[1]) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x3e9);
        abort();
      }
      lVar6 = lVar6 + 1;
    } while (this->m_total_blocks != (uint32_t)lVar6);
  }
  return;
}

Assistant:

void basisu_frontend::generate_block_endpoint_clusters()
	{
		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_endpoint_clusters.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_endpoint_clusters[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter] >> 1;
				const uint32_t subblock_index = cluster_indices[cluster_indices_iter] & 1;

				m_block_endpoint_clusters_indices[block_index][subblock_index] = cluster_index;

			} // cluster_indices_iter
		}

		if (m_params.m_validate)
		{
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				uint32_t cluster_0 = m_block_endpoint_clusters_indices[block_index][0];
				uint32_t cluster_1 = m_block_endpoint_clusters_indices[block_index][1];
				BASISU_FRONTEND_VERIFY(cluster_0 == cluster_1);
			}
		}
	}